

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
::split(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
        *this,int insert_position,
       btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
       *dest,allocator_type *alloc)

{
  size_type i;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  bVar1;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  bVar2;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  bVar3;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  *c;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  *pbVar4;
  ulong uVar5;
  uint i_00;
  allocator_type *in_R9;
  ulong uVar6;
  long lVar7;
  
  if (((ulong)dest & 7) == 0) {
    if (dest[10] !=
        (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
         )0x0) {
      __assert_fail("dest->count() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x8fb,
                    "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                   );
    }
    if (((ulong)this & 7) == 0) {
      if ((this[0xb] !=
           (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            )0x0) &&
         (this[0xb] !=
          (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
           )0x3d)) {
        __assert_fail("max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x8fc,
                      "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                     );
      }
      if (insert_position == 0x3d) {
        bVar2 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                 )0x0;
      }
      else if (insert_position == 0) {
        bVar2 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                 )((char)this[10] - 1);
      }
      else {
        bVar2 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                 )((byte)this[10] >> 1);
      }
      dest[10] = bVar2;
      bVar2 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
               )((char)this[10] - (char)bVar2);
      this[10] = bVar2;
      if (bVar2 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    )0x0) {
        __assert_fail("count() >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x90a,
                      "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                     );
      }
      uninitialized_move_n(this,(ulong)(byte)dest[10],(ulong)(byte)bVar2,0,dest,in_R9);
      bVar2 = this[10];
      this[10] = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  )((char)bVar2 - 1U);
      pbVar4 = *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                 **)this;
      if (((ulong)pbVar4 & 7) == 0) {
        bVar1 = this[8];
        uVar6 = (ulong)(byte)bVar1;
        bVar3 = pbVar4[10];
        if ((byte)bVar3 < (byte)bVar1) {
          __assert_fail("i <= count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x852,
                        "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>, Args = <int *>]"
                       );
        }
        if ((byte)bVar1 < (byte)bVar3) {
          uVar5 = (ulong)(byte)bVar3;
          *(undefined4 *)(pbVar4 + uVar5 * 4 + 0xc) = *(undefined4 *)(pbVar4 + uVar5 * 4 + 8);
          uVar5 = uVar5 - 1;
          if (uVar6 < uVar5) {
            do {
              *(undefined4 *)(pbVar4 + uVar5 * 4 + 0xc) = *(undefined4 *)(pbVar4 + uVar5 * 4 + 8);
              uVar5 = uVar5 - 1;
            } while (uVar6 < uVar5);
            bVar3 = pbVar4[10];
          }
        }
        *(undefined4 *)(pbVar4 + uVar6 * 4 + 0xc) =
             *(undefined4 *)(this + (ulong)(byte)((char)bVar2 - 1U) * 4 + 0xc);
        bVar3 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                 )((char)bVar3 + 1);
        pbVar4[10] = bVar3;
        if (pbVar4[0xb] ==
            (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
             )0x0) {
          uVar6 = uVar6 + 1;
          uVar5 = (ulong)(byte)bVar3;
          if (uVar6 < (byte)bVar3) {
            do {
              i = uVar5 - 1;
              c = child(pbVar4,i);
              set_child(pbVar4,uVar5,c);
              uVar5 = i;
            } while ((long)uVar6 < (long)i);
            mutable_child(pbVar4,uVar6);
          }
        }
        init_child(*(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                     **)this,(byte)this[8] + 1,dest);
        if (this[0xb] ==
            (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
             )0x0) {
          i_00 = 0xffffffff;
          lVar7 = 1;
          do {
            pbVar4 = child(this,(ulong)(byte)this[10] + lVar7);
            if (pbVar4 == (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                           *)0x0) {
              __assert_fail("child(count() + i + 1) != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x91a,
                            "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                           );
            }
            i_00 = i_00 + 1;
            pbVar4 = child(this,(ulong)(byte)this[10] + lVar7);
            init_child(dest,i_00,pbVar4);
            mutable_child(this,(ulong)(byte)this[10] + lVar7);
            lVar7 = lVar7 + 1;
          } while (i_00 < (byte)dest[10]);
        }
        return;
      }
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }